

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::RasterizationSamplesInstance::iterate
          (TestStatus *__return_storage_ptr__,RasterizationSamplesInstance *this)

{
  MultisampleRenderer *this_00;
  TextureLevel *this_01;
  PixelBufferAccess local_50;
  undefined1 local_28 [8];
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> level;
  RasterizationSamplesInstance *this_local;
  
  level.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data._8_8_ =
       this;
  this_00 = de::details::
            UniqueBase<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer,_de::DefaultDeleter<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer>_>
            ::operator->(&(this->m_multisampleRenderer).
                          super_UniqueBase<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer,_de::DefaultDeleter<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer>_>
                        );
  MultisampleRenderer::render
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_28,this_00)
  ;
  this_01 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
            operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                       local_28);
  tcu::TextureLevel::getAccess(&local_50,this_01);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(__return_storage_ptr__,this,&local_50);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus RasterizationSamplesInstance::iterate (void)
{
	de::MovePtr<tcu::TextureLevel> level(m_multisampleRenderer->render());
	return verifyImage(level->getAccess());
}